

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  sqlite3_value *pRec;
  sqlite3_value **ppsVar1;
  u8 uVar2;
  int iVar3;
  Mem *pMVar4;
  size_t sVar5;
  char affinity_00;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  MemValue MVar6;
  long lVar7;
  char *pcVar8;
  byte bVar9;
  uint uVar10;
  sqlite3_value *pVal;
  sqlite3_value *local_50;
  int local_44;
  undefined4 local_40;
  undefined4 local_3c;
  sqlite3_value **local_38;
  
  local_50 = (Mem *)0x0;
  for (; (bVar9 = pExpr->op, bVar9 == 0xa2 || (bVar9 == 0xa9)); pExpr = pExpr->pLeft) {
  }
  if (bVar9 == 0xa4) {
    bVar9 = pExpr->op2;
  }
  pcVar8 = "";
  lVar7 = 1;
  local_38 = ppVal;
  if (bVar9 == 0xa1) {
    bVar9 = pExpr->pLeft->op;
    if ((bVar9 | 2) == 0x8f) {
      pcVar8 = "-";
      lVar7 = -1;
      pExpr = pExpr->pLeft;
    }
    else {
      bVar9 = 0xa1;
    }
  }
  else if (bVar9 == 0x24) {
    uVar2 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
    ppsVar1 = local_38;
    iVar3 = valueFromExpr(db,pExpr->pLeft,enc,uVar2,local_38,pCtx);
    pMVar4 = *ppsVar1;
    if (pMVar4 == (Mem *)0x0) {
      return iVar3;
    }
    sqlite3VdbeMemCast(pMVar4,uVar2,'\x01');
    applyAffinity(*ppsVar1,affinity,'\x01');
    return iVar3;
  }
  local_44 = 0;
  if (bVar9 < 0x8e) {
    if (bVar9 != 0x6a) {
      if (bVar9 == 0x6e) {
        local_50 = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
        if (local_50 == (Mem *)0x0) {
          local_50 = (sqlite3_value *)0x0;
          goto LAB_00156603;
        }
        local_50->flags = 1;
        local_50->db = db;
        sqlite3VdbeMemNumerify(local_50);
        goto LAB_001566e4;
      }
      if (bVar9 != 0x8d) goto LAB_001566e4;
    }
  }
  else {
    if (0x9a < bVar9) {
      if (bVar9 == 0x9b) {
        local_50 = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
        if (local_50 != (Mem *)0x0) {
          local_50->flags = 1;
          local_50->db = db;
        }
        local_50->flags = 4;
        MVar6.i._1_7_ = 0;
        MVar6.i._0_1_ = (pExpr->u).zToken[4] == '\0';
        local_50->u = MVar6;
      }
      else if ((bVar9 == 0xa1) &&
              (iVar3 = valueFromExpr(db,pExpr->pLeft,enc,affinity,&local_50,pCtx), pRec = local_50,
              local_50 != (Mem *)0x0 && iVar3 == 0)) {
        sqlite3VdbeMemNumerify(local_50);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_001566e4;
    }
    if (bVar9 == 0x8e) {
      pMVar4 = (Mem *)sqlite3DbMallocZero(db,0x38);
      if (pMVar4 != (Mem *)0x0) {
        pMVar4->flags = 1;
        pMVar4->db = db;
        pcVar8 = (pExpr->u).zToken;
        local_50 = pMVar4;
        sVar5 = strlen(pcVar8 + 2);
        uVar10 = (uint)sVar5 & 0x3fffffff;
        iVar3 = uVar10 - 1;
        pcVar8 = (char *)sqlite3HexToBlob(db,pcVar8 + 2,iVar3);
        sqlite3VdbeMemSetStr
                  (pMVar4,pcVar8,(int)((uVar10 - (iVar3 >> 0x1f)) + -1) >> 1,'\0',sqlite3MallocSize)
        ;
        goto LAB_001566e4;
      }
      local_50 = (sqlite3_value *)0x0;
      goto LAB_00156603;
    }
    if (bVar9 != 0x8f) goto LAB_001566e4;
  }
  local_40 = (int)CONCAT71(in_register_00000011,enc);
  local_3c = (int)CONCAT71(in_register_00000009,affinity);
  pMVar4 = (Mem *)sqlite3DbMallocZero(db,0x38);
  local_50 = pMVar4;
  if (pMVar4 != (Mem *)0x0) {
    pMVar4->flags = 1;
    pMVar4->db = db;
    if ((pExpr->flags & 0x400) == 0) {
      pcVar8 = sqlite3MPrintf(db,"%s%s",pcVar8,(pExpr->u).zToken);
      if (pcVar8 == (char *)0x0) goto LAB_00156603;
      sqlite3VdbeMemSetStr(pMVar4,pcVar8,-1,'\x01',sqlite3MallocSize);
    }
    else {
      lVar7 = lVar7 * (pExpr->u).iValue;
      if ((pMVar4->flags & 0x2400) == 0) {
        (pMVar4->u).i = lVar7;
        pMVar4->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMVar4,lVar7);
      }
    }
    affinity_00 = 'C';
    if ((char)local_3c != 'A' || (bVar9 & 0xfd) != 0x8d) {
      affinity_00 = (char)local_3c;
    }
    applyAffinity(pMVar4,affinity_00,'\x01');
    if ((pMVar4->flags & 0xc) != 0) {
      pMVar4->flags = pMVar4->flags & 0xfffd;
    }
    uVar2 = (u8)local_40;
    if (((uVar2 != '\x01') && ((pMVar4->flags & 2) != 0)) && (pMVar4->enc != uVar2)) {
      local_44 = sqlite3VdbeMemTranslate(pMVar4,uVar2);
    }
LAB_001566e4:
    *local_38 = local_50;
    return local_44;
  }
LAB_00156603:
  if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  sqlite3ValueFree(local_50);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  Expr *pExpr,                    /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
#if defined(SQLITE_ENABLE_STAT3_OR_STAT4)
  if( op==TK_REGISTER ) op = pExpr->op2;
#else
  if( NEVER(op==TK_REGISTER) ) op = pExpr->op2;
#endif

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, SQLITE_UTF8);
      sqlite3ValueApplyAffinity(*ppVal, affinity, SQLITE_UTF8);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    if( pVal->flags & (MEM_Int|MEM_Real) ) pVal->flags &= ~MEM_Str;
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx) 
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
        pVal->u.r = -(double)SMALLEST_INT64;
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemNumerify(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
     pVal = valueNew(db, pCtx);
     pVal->flags = MEM_Int;
     pVal->u.i = pExpr->u.zToken[4]==0;
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 || pCtx->pParse->nErr==0 )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}